

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnBrTableExpr
          (BinaryReaderObjdumpDisassemble *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  char *pcVar1;
  ulong uVar2;
  string buffer;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50;
  
  if (this->in_function_body == true) {
    local_70 = local_60;
    local_68 = 0;
    local_60[0] = 0;
    for (uVar2 = 0; num_targets != uVar2; uVar2 = uVar2 + 1) {
      std::__cxx11::to_string(&local_50,target_depths[uVar2]);
      pcVar1 = (char *)std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::append(pcVar1);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::to_string(&local_50,default_target_depth);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::_M_dispose();
    LogOpcode(this,"%s",local_70);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnBrTableExpr(
    Index num_targets,
    Index* target_depths,
    Index default_target_depth) {
  if (!in_function_body) {
    return Result::Ok;
  }

  std::string buffer = std::string();
  for (Index i = 0; i < num_targets; i++) {
    buffer.append(std::to_string(target_depths[i])).append(" ");
  }
  buffer.append(std::to_string(default_target_depth));

  LogOpcode("%s", buffer.c_str());
  return Result::Ok;
}